

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  element_type *this;
  state sVar1;
  ostream *poVar2;
  undefined **__n;
  void *__buf;
  int iVar3;
  pointer *__ptr;
  int iVar4;
  url *puVar5;
  duration<long,_std::ratio<1L,_1L>_> local_2c8;
  thread t;
  shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>_>
  executor;
  once_flag once;
  shared_ptr<boost::asio::io_context> ctx;
  undefined1 local_290 [32];
  shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>
  stream;
  context ssl_ctx;
  string local_248;
  async_session session;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  string local_1d0 [32];
  url url;
  url local_f0;
  
  boost::asio::ssl::context::context(&ssl_ctx,tlsv12_client);
  once._M_once = 0;
  m2d::root_cert_abi_cxx11_();
  std::
  call_once<void(&)(std::__cxx11::string_const&,boost::asio::ssl::context&),std::__cxx11::string_const,boost::asio::ssl::context&>
            (&once,m2d::savanna::load_root_cert,&url.scheme_,&ssl_ctx);
  std::__cxx11::string::~string((string *)&url);
  std::make_shared<boost::asio::io_context>();
  std::__cxx11::string::string((string *)&local_248,"ws://localhost:80",(allocator *)&session);
  m2d::savanna::url::url(&url,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::
  make_shared<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true>,boost::asio::io_context&>
            ((io_context *)&stream);
  session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header;
  session.ssl_cache_._M_t._M_impl._0_8_ = 0;
  session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       session.ssl_cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2> *)(local_290 + 0x10)
             ,&ctx.super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>);
  std::
  __shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_290,
                 &stream.
                  super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
                );
  m2d::savanna::url::url(&local_f0,&url);
  puVar5 = &local_f0;
  m2d::savanna::async_websocket::async_session::
  prepare<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true>>>
            ((async_session *)&executor,(shared_ptr<boost::asio::io_context> *)&session,
             (shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>
              *)(local_290 + 0x10),(url *)local_290);
  m2d::savanna::url::~url(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_290 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_290 + 0x18));
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = (pointer)0x0;
  local_1e0 = std::
              _Function_handler<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/example/async_websocket/main.cpp:32:23)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/example/async_websocket/main.cpp:32:23)>
              ::_M_manager;
  boost::optional_detail::
  optional_base<std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>_>::
  assign(&((executor.
            super___shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->on_message_handler_).super_type,(argument_type)&local_1f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
  t._M_id._M_thread = (id)0;
  local_2c8.__r = (rep)operator_new(0x10);
  __n = &PTR___State_00243ce8;
  *(undefined ***)local_2c8.__r = &PTR___State_00243ce8;
  *(async_session **)(local_2c8.__r + 8) = (async_session *)&executor;
  std::thread::_M_start_thread(&t,&local_2c8,0);
  if ((long *)local_2c8.__r != (long *)0x0) {
    (**(code **)(*(long *)local_2c8.__r + 8))();
  }
  std::thread::detach();
  iVar3 = -3;
  iVar4 = -1;
  while ((executor.
          super___shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->current_state_ != connected) {
    poVar2 = std::operator<<((ostream *)&std::cout,"connecting...");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_2c8.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_2c8);
    iVar3 = iVar3 + 1;
    if (iVar3 == 0) goto LAB_0010f925;
  }
  sVar1 = connected;
  while (sVar1 == connected) {
    poVar2 = std::operator<<((ostream *)&std::cout,"send: hello");
    std::endl<char,std::char_traits<char>>(poVar2);
    this = executor.
           super___shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    std::__cxx11::string::string(local_1d0,"hello",(allocator *)&local_2c8);
    m2d::savanna::async_websocket::
    reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
    ::send(this,(int)local_1d0,__buf,(size_t)__n,(int)puVar5);
    std::__cxx11::string::~string(local_1d0);
    local_2c8.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_2c8);
    sVar1 = (executor.
             super___shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->current_state_;
  }
  iVar4 = 0;
LAB_0010f925:
  std::thread::~thread(&t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&executor.
              super___shared_ptr<m2d::savanna::async_websocket::reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
               *)&session);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stream.
              super___shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  m2d::savanna::url::~url(&url);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  boost::asio::ssl::context::~context(&ssl_ctx);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
	ssl::context ssl_ctx(ssl::context::tlsv12_client);
	std::once_flag once;
	std::call_once(once, savanna::load_root_cert, m2d::root_cert(), ssl_ctx);

	auto ctx = std::make_shared<net::io_context>();

	// savanna::url url("ws://echo.websocket.org");
	// auto stream = savanna::websocket::raw_stream(ctx);
	// savanna::websocket::session<savanna::websocket::raw_stream> session(std::move(resolver), std::move(stream), url);

	savanna::url url("ws://localhost:80");
	auto stream = std::make_shared<savanna::async_websocket::raw_stream>(*ctx);
	savanna::async_websocket::async_session session;

	auto executor = session.prepare(ctx, stream, url);

	executor->on_message([](beast::flat_buffer buffer) {
		std::cout << "received: " << beast::make_printable(buffer.data()) << std::endl;
	});

	std::thread t([&]() {
		try {
			executor->run();
		} catch (boost::system::system_error e) {
			std::cout << "Error: " << e.what() << std::endl;
		}
	});
	t.detach();

	int retry_count = 3;
	while (executor->current_state() != savanna::async_websocket::state::connected && retry_count > 0) {
		std::cout << "connecting..." << std::endl;
		std::this_thread::sleep_for(std::chrono::seconds(1));
		retry_count--;
		if (retry_count == 0) {
			return -1;
		}
	}

	while (executor->current_state() == savanna::async_websocket::state::connected) {
		std::cout << "send: hello" << std::endl;
		executor->send("hello");
		std::this_thread::sleep_for(std::chrono::seconds(1));
	}
	return 0;
}